

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O3

Type kj::anon_unknown_9::modeToType(mode_t mode)

{
  Type TVar1;
  uint uVar2;
  
  uVar2 = (mode & 0xf000) - 0x1000;
  TVar1 = OTHER;
  if (uVar2 < 0xc000) {
    TVar1 = *(Type *)(&DAT_0022df4c + (uVar2 >> 10));
  }
  return TVar1;
}

Assistant:

static FsNode::Type modeToType(mode_t mode) {
  switch (mode & S_IFMT) {
    case S_IFREG : return FsNode::Type::FILE;
    case S_IFDIR : return FsNode::Type::DIRECTORY;
    case S_IFLNK : return FsNode::Type::SYMLINK;
    case S_IFBLK : return FsNode::Type::BLOCK_DEVICE;
    case S_IFCHR : return FsNode::Type::CHARACTER_DEVICE;
    case S_IFIFO : return FsNode::Type::NAMED_PIPE;
    case S_IFSOCK: return FsNode::Type::SOCKET;
    default: return FsNode::Type::OTHER;
  }
}